

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void>_>
         *this)

{
  FloatFormat *pFVar1;
  double *pdVar2;
  bool *pbVar3;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  bool *pbVar6;
  ostringstream *poVar7;
  Precision PVar8;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar9;
  Statement *pSVar10;
  ShaderExecutor *pSVar11;
  Variable<tcu::Vector<float,_3>_> *pVVar12;
  pointer pcVar13;
  Variable<tcu::Matrix<float,_3,_3>_> *pVVar14;
  double dVar15;
  undefined7 uVar16;
  pointer pVVar17;
  bool bVar18;
  int iVar19;
  undefined8 uVar20;
  IVal *pIVar21;
  IVal *pIVar22;
  undefined8 *puVar23;
  uint uVar24;
  long lVar25;
  Interval *pIVar26;
  int row;
  long lVar27;
  long lVar28;
  long lVar29;
  char *pcVar30;
  _Base_ptr p_Var31;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar32;
  Interval *__return_storage_ptr___00;
  byte bVar33;
  IVal in2;
  IVal reference1;
  FuncSet funcs;
  IVal in3;
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void>_>
  outputs;
  FloatFormat highpFmt;
  IVal reference0;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  ResultCollector status;
  ostringstream oss;
  deUint32 in_stack_fffffffffffffa98;
  undefined1 local_560 [12];
  undefined4 uStack_554;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_550;
  undefined1 auStack_540 [7];
  IVal local_539;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_538;
  undefined1 local_530 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_520;
  _Rb_tree_node_base *local_510;
  double local_508;
  size_t local_4e8;
  IVal *local_4e0;
  TestStatus *local_4d8;
  long local_4d0;
  string local_4c8;
  long local_4a8;
  FloatFormat *local_4a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_498;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void>_>
  local_468;
  FloatFormat local_438;
  undefined1 local_408 [32];
  double local_3e8;
  Precision local_3e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_3d8;
  undefined4 local_3d0;
  ios_base local_398 [8];
  ios_base local_390 [264];
  pointer local_288;
  pointer local_280;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_278;
  pointer local_218;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  ResultCollector local_1f8;
  IVal local_1a8;
  ios_base local_138 [264];
  
  bVar33 = 0;
  this_00 = this->m_samplings;
  pFVar1 = &(this->m_caseCtx).floatFormat;
  PVar8 = (this->m_caseCtx).precision;
  sVar9 = (this->m_caseCtx).numRandoms;
  local_4d8 = __return_storage_ptr__;
  iVar19 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_4a0 = pFVar1;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_278,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar1,(FloatFormat *)(ulong)PVar8,(Precision)sVar9,(ulong)(iVar19 + 0xdeadbeef),
             in_stack_fffffffffffffa98);
  pVVar17 = local_278.in0.
            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_4e8 = ((long)local_278.in0.
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_278.in0.
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void>_>::
  Outputs(&local_468,local_4e8);
  local_438.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_438.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_438.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_438.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_438.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_438.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_438.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_438.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_438._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_498._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_498._M_impl.super__Rb_tree_header._M_header;
  local_498._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_498._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_498._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_498._M_impl.super__Rb_tree_header._M_header._M_right =
       local_498._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_1f8);
  local_538 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218 = local_278.in0.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_210 = local_278.in1.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_208 = local_278.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_200 = local_278.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_288 = local_468.out0.
              super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_280 = local_468.out1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar7 = (ostringstream *)(local_408 + 8);
  local_408._0_8_ = local_538;
  std::__cxx11::ostringstream::ostringstream(poVar7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(false);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar7);
  std::ios_base::~ios_base(local_390);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  p_Var5 = (_Rb_tree_node_base *)(local_530 + 8);
  local_530._8_4_ = _S_red;
  local_520._M_allocated_capacity = 0;
  local_508 = 0.0;
  pSVar10 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_520._8_8_ = p_Var5;
  local_510 = p_Var5;
  (*pSVar10->_vptr_Statement[4])(pSVar10,local_530);
  if ((_Rb_tree_node_base *)local_520._8_8_ != p_Var5) {
    uVar20 = local_520._8_8_;
    do {
      (**(code **)(**(long **)(uVar20 + 0x20) + 0x30))(*(long **)(uVar20 + 0x20),&local_1a8);
      uVar20 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar20);
    } while ((_Rb_tree_node_base *)uVar20 != p_Var5);
  }
  if (local_508 != 0.0) {
    poVar7 = (ostringstream *)(local_408 + 8);
    local_408._0_8_ = local_538;
    std::__cxx11::ostringstream::ostringstream(poVar7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar7,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar7,(char *)local_560._0_8_,CONCAT44(uStack_554,local_560._8_4_));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_560._0_8_ != &local_550) {
      operator_delete((void *)local_560._0_8_,local_550._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar7);
    std::ios_base::~ios_base(local_390);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_530);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  pSVar11 = (this->m_executor).
            super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
            .m_data.ptr;
  (*pSVar11->_vptr_ShaderExecutor[2])(pSVar11,local_4e8,&local_218,&local_288,0);
  lVar27 = 0x10;
  do {
    *(undefined1 *)((long)local_1a8.m_data + lVar27 + -0x10) = 0;
    *(undefined8 *)((long)&(&local_1a8)[-1].m_data[2].m_hi + lVar27) = 0x7ff0000000000000;
    *(undefined8 *)(&local_1a8.m_data[0].m_hasNaN + lVar27) = 0xfff0000000000000;
    lVar27 = lVar27 + 0x18;
  } while (lVar27 != 0x58);
  lVar27 = 0x10;
  do {
    *(undefined1 *)((long)local_1a8.m_data + lVar27 + -0x10) = 0;
    *(undefined8 *)((long)&(&local_1a8)[-1].m_data[2].m_hi + lVar27) = 0x7ff0000000000000;
    *(undefined8 *)(&local_1a8.m_data[0].m_hasNaN + lVar27) = 0xfff0000000000000;
    lVar27 = lVar27 + 0x18;
  } while (lVar27 != 0x58);
  lVar27 = 0x10;
  do {
    auStack_540[lVar27] = 0;
    *(undefined8 *)((long)&local_538 + lVar27) = 0x7ff0000000000000;
    *(undefined8 *)(local_530 + lVar27) = 0xfff0000000000000;
    lVar27 = lVar27 + 0x18;
  } while (lVar27 != 0x58);
  lVar27 = 0x10;
  do {
    auStack_540[lVar27] = 0;
    *(undefined8 *)((long)&local_538 + lVar27) = 0x7ff0000000000000;
    *(undefined8 *)(local_530 + lVar27) = 0xfff0000000000000;
    lVar27 = lVar27 + 0x18;
  } while (lVar27 != 0x58);
  tcu::Matrix<tcu::Interval,_3,_3>::Matrix((Matrix<tcu::Interval,_3,_3> *)local_408);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_498,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.m_ptr,
             &local_1a8);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_498,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.m_ptr,
             (IVal *)local_530);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_560);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4c8);
  Environment::bind<tcu::Matrix<float,3,3>>
            ((Environment *)&local_498,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_3>_>_>.m_ptr,
             (IVal *)local_408);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_539);
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_finish == pVVar17) {
    local_4e0 = (IVal *)0x0;
  }
  else {
    local_4a8 = local_4e8 + (local_4e8 == 0);
    lVar27 = 0;
    local_4e0 = (IVal *)0x0;
    do {
      tcu::Matrix<tcu::Interval,_3,_3>::Matrix((Matrix<tcu::Interval,_3,_3> *)local_1a8.m_data);
      pFVar1 = local_4a0;
      local_560._8_4_ =
           local_278.in0.
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start[lVar27].m_data[2];
      local_560._0_8_ =
           *(undefined8 *)
            local_278.in0.
            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar27].m_data;
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doRound
                ((IVal *)local_530,local_4a0,(Vector<float,_3> *)local_560);
      __return_storage_ptr___00 = (Interval *)local_408;
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)__return_storage_ptr___00,pFVar1,(IVal *)local_530);
      pIVar21 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_498,
                           (this->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      local_4d0 = lVar27;
      pIVar26 = __return_storage_ptr___00;
      for (lVar25 = 9; lVar25 != 0; lVar25 = lVar25 + -1) {
        uVar16 = *(undefined7 *)&(((IVal *)pIVar26)->m_data).m_data[0].m_data[0].field_0x1;
        pIVar21->m_data[0].m_hasNaN = (((IVal *)pIVar26)->m_data).m_data[0].m_data[0].m_hasNaN;
        *(undefined7 *)&pIVar21->m_data[0].field_0x1 = uVar16;
        pIVar26 = (Interval *)((long)pIVar26 + ((ulong)bVar33 * -2 + 1) * 8);
        pIVar21 = (IVal *)((long)pIVar21 + ((ulong)bVar33 * -2 + 1) * 8);
      }
      local_560._8_4_ =
           local_278.in1.
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start[lVar27].m_data[2];
      local_560._0_8_ =
           *(undefined8 *)
            local_278.in1.
            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar27].m_data;
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doRound
                ((IVal *)local_530,pFVar1,(Vector<float,_3> *)local_560);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)__return_storage_ptr___00,pFVar1,(IVal *)local_530);
      pIVar21 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_498,
                           (this->m_variables).in1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      pIVar26 = __return_storage_ptr___00;
      for (lVar25 = 9; lVar25 != 0; lVar25 = lVar25 + -1) {
        uVar16 = *(undefined7 *)&(((IVal *)pIVar26)->m_data).m_data[0].m_data[0].field_0x1;
        pIVar21->m_data[0].m_hasNaN = (((IVal *)pIVar26)->m_data).m_data[0].m_data[0].m_hasNaN;
        *(undefined7 *)&pIVar21->m_data[0].field_0x1 = uVar16;
        pIVar26 = (Interval *)((long)pIVar26 + ((ulong)bVar33 * -2 + 1) * 8);
        pIVar21 = (IVal *)((long)pIVar21 + ((ulong)bVar33 * -2 + 1) * 8);
      }
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (this->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (this->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_3e0 = (this->m_caseCtx).precision;
      local_3e8 = pFVar1->m_maxValue;
      local_408._0_8_ = *(undefined8 *)pFVar1;
      local_408._8_4_ = pFVar1->m_fractionBits;
      local_408._12_4_ = pFVar1->m_hasSubnormal;
      local_408._16_4_ = pFVar1->m_hasInf;
      local_408._20_4_ = pFVar1->m_hasNaN;
      local_408[0x18] = pFVar1->m_exactPrecision;
      local_408._25_3_ = *(undefined3 *)&pFVar1->field_0x19;
      local_408._28_4_ = *(undefined4 *)&pFVar1->field_0x1c;
      local_3d0 = 0;
      pSVar10 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_3d8 = &local_498;
      (*pSVar10->_vptr_Statement[3])(pSVar10,__return_storage_ptr___00);
      pIVar22 = Environment::lookup<tcu::Matrix<float,3,3>>
                          ((Environment *)&local_498,
                           (this->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_3>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_3,_3>,_tcu::Matrix<tcu::Interval,_3,_3>_>::doConvert
                ((IVal *)__return_storage_ptr___00,&local_438,pIVar22);
      lVar25 = local_4d0;
      lVar28 = 0;
      pIVar26 = local_1a8.m_data;
      do {
        lVar29 = 0;
        do {
          *(undefined8 *)((long)&pIVar26->m_hi + lVar29) =
               *(undefined8 *)((long)&__return_storage_ptr___00->m_hi + lVar29);
          pbVar6 = &((Vector<tcu::Vector<tcu::Interval,_3>,_3> *)
                    &__return_storage_ptr___00->m_hasNaN)->m_data[0].m_data[0].m_hasNaN + lVar29;
          dVar15 = *(double *)(pbVar6 + 8);
          pbVar3 = &((Vector<tcu::Vector<tcu::Interval,_3>,_3> *)&pIVar26->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar29;
          *(undefined8 *)pbVar3 = *(undefined8 *)pbVar6;
          *(double *)(pbVar3 + 8) = dVar15;
          lVar29 = lVar29 + 0x48;
        } while (lVar29 != 0xd8);
        lVar28 = lVar28 + 1;
        pIVar26 = pIVar26 + 1;
        __return_storage_ptr___00 = __return_storage_ptr___00 + 1;
      } while (lVar28 != 3);
      bVar18 = contains<tcu::Matrix<float,3,3>>
                         ((IVal *)local_1a8.m_data,
                          local_468.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + local_4d0);
      local_408._0_8_ = local_408 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_408,"Shader output 0 is outside acceptable range","");
      bVar18 = tcu::ResultCollector::check(&local_1f8,bVar18,(string *)local_408);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_408 + 0x10)) {
        operator_delete((void *)local_408._0_8_,CONCAT44(local_408._20_4_,local_408._16_4_) + 1);
      }
      uVar24 = (int)local_4e0 + ((byte)~bVar18 & 1);
      pIVar22 = (IVal *)(ulong)uVar24;
      lVar28 = lVar25;
      local_4e0 = pIVar22;
      if ((int)uVar24 < 0x65 && !bVar18) {
        local_408._0_8_ = local_538;
        poVar7 = (ostringstream *)(local_408 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar7);
        pcVar30 = "Failed";
        if (bVar18) {
          pcVar30 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,pcVar30,6);
        lVar28 = local_4d0;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"\t",1);
        pVVar12 = (this->m_variables).in0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.
                  m_ptr;
        pcVar13 = (pVVar12->m_name)._M_dataplus._M_p;
        local_530._0_8_ = &local_520;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_530,pcVar13,pcVar13 + (pVVar12->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar7,(char *)local_530._0_8_,
                   CONCAT44(local_530._12_4_,local_530._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7," = ",3);
        valueToString<tcu::Vector<float,3>>
                  ((string *)local_560,(shaderexecutor *)&local_438,
                   (FloatFormat *)
                   (local_278.in0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar27),(Vector<float,_3> *)pIVar22)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar7,(char *)local_560._0_8_,CONCAT44(uStack_554,local_560._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_560._0_8_ != &local_550) {
          operator_delete((void *)local_560._0_8_,local_550._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_530._0_8_ != &local_520) {
          operator_delete((void *)local_530._0_8_,(ulong)(local_520._M_allocated_capacity + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"\t",1);
        pVVar12 = (this->m_variables).in1.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.
                  m_ptr;
        pcVar13 = (pVVar12->m_name)._M_dataplus._M_p;
        local_530._0_8_ = &local_520;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_530,pcVar13,pcVar13 + (pVVar12->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar7,(char *)local_530._0_8_,
                   CONCAT44(local_530._12_4_,local_530._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7," = ",3);
        valueToString<tcu::Vector<float,3>>
                  ((string *)local_560,(shaderexecutor *)&local_438,
                   (FloatFormat *)
                   (local_278.in1.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar27),(Vector<float,_3> *)pIVar22)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar7,(char *)local_560._0_8_,CONCAT44(uStack_554,local_560._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_560._0_8_ != &local_550) {
          operator_delete((void *)local_560._0_8_,local_550._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_530._0_8_ != &local_520) {
          operator_delete((void *)local_530._0_8_,(ulong)(local_520._M_allocated_capacity + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"\t",1);
        pVVar14 = (this->m_variables).out0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_3>_>_>.
                  m_ptr;
        pcVar13 = (pVVar14->m_name)._M_dataplus._M_p;
        local_530._0_8_ = &local_520;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_530,pcVar13,pcVar13 + (pVVar14->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar7,(char *)local_530._0_8_,
                   CONCAT44(local_530._12_4_,local_530._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7," = ",3);
        valueToString<tcu::Matrix<float,3,3>>
                  ((string *)local_560,(shaderexecutor *)&local_438,
                   (FloatFormat *)
                   (local_468.out0.
                    super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar25),
                   (Matrix<float,_3,_3> *)pIVar22);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar7,(char *)local_560._0_8_,CONCAT44(uStack_554,local_560._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar7,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,3,3>>
                  (&local_4c8,(shaderexecutor *)&local_438,(FloatFormat *)&local_1a8,pIVar22);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar7,local_4c8._M_dataplus._M_p,local_4c8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
          operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_560._0_8_ != &local_550) {
          operator_delete((void *)local_560._0_8_,local_550._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_530._0_8_ != &local_520) {
          operator_delete((void *)local_530._0_8_,(ulong)(local_520._M_allocated_capacity + 1));
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar7);
        std::ios_base::~ios_base(local_390);
      }
      lVar27 = lVar28 + 1;
    } while (lVar27 != local_4a8);
  }
  iVar19 = (int)local_4e0;
  if (100 < iVar19) {
    poVar7 = (ostringstream *)(local_408 + 8);
    local_408._0_8_ = local_538;
    std::__cxx11::ostringstream::ostringstream(poVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"(Skipped ",9);
    std::ostream::operator<<(poVar7,iVar19 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar7);
    std::ios_base::~ios_base(local_390);
  }
  poVar7 = (ostringstream *)(local_408 + 8);
  if (iVar19 == 0) {
    local_408._0_8_ = local_538;
    std::__cxx11::ostringstream::ostringstream(poVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_408._0_8_ = local_538;
    std::__cxx11::ostringstream::ostringstream(poVar7);
    std::ostream::operator<<(poVar7,iVar19);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar7," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_408,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream(poVar7);
  std::ios_base::~ios_base(local_390);
  if (iVar19 == 0) {
    local_408._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_408 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"Pass","");
    local_4d8->m_code = QP_TEST_RESULT_PASS;
    (local_4d8->m_description)._M_dataplus._M_p = (pointer)&(local_4d8->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4d8->m_description,local_408._0_8_,
               (char *)(local_408._0_8_ + CONCAT44(local_408._12_4_,local_408._8_4_)));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_408 + 0x10)) goto LAB_009830c3;
    uVar20 = (_Base_ptr)CONCAT44(local_408._20_4_,local_408._16_4_);
    paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._0_8_;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_408);
    std::ostream::operator<<(local_408,iVar19);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_408);
    std::ios_base::~ios_base(local_398);
    paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_408 + 0x10);
    local_408._0_8_ = paVar32;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_408," test failed. Check log for the details","");
    p_Var4 = (_Base_ptr)
             (CONCAT44(local_408._12_4_,local_408._8_4_) +
             CONCAT44(local_530._12_4_,local_530._8_4_));
    uVar20 = (_Base_ptr)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_530._0_8_ != &local_520) {
      uVar20 = local_520._M_allocated_capacity;
    }
    if ((ulong)uVar20 < p_Var4) {
      p_Var31 = (_Base_ptr)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._0_8_ != paVar32) {
        p_Var31 = (_Base_ptr)CONCAT44(local_408._20_4_,local_408._16_4_);
      }
      if (p_Var31 < p_Var4) goto LAB_00982f4a;
      puVar23 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_408,0,(char *)0x0,local_530._0_8_);
    }
    else {
LAB_00982f4a:
      puVar23 = (undefined8 *)std::__cxx11::string::_M_append(local_530,local_408._0_8_);
    }
    local_1a8.m_data[0]._0_8_ = &local_1a8.m_data[0].m_hi;
    pdVar2 = (double *)(puVar23 + 2);
    if ((double *)*puVar23 == pdVar2) {
      local_1a8.m_data[0].m_hi = *pdVar2;
      local_1a8.m_data[1]._0_4_ = *(undefined4 *)(puVar23 + 3);
      local_1a8.m_data[1]._4_4_ = *(undefined4 *)((long)puVar23 + 0x1c);
    }
    else {
      local_1a8.m_data[0].m_hi = *pdVar2;
      local_1a8.m_data[0]._0_8_ = (double *)*puVar23;
    }
    local_1a8.m_data[0].m_lo = (double)puVar23[1];
    *puVar23 = pdVar2;
    puVar23[1] = 0;
    *(undefined1 *)pdVar2 = 0;
    local_4d8->m_code = QP_TEST_RESULT_FAIL;
    (local_4d8->m_description)._M_dataplus._M_p = (pointer)&(local_4d8->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4d8->m_description,local_1a8.m_data[0]._0_8_,
               (undefined1 *)((long)local_1a8.m_data[0].m_lo + local_1a8.m_data[0]._0_8_));
    if ((double *)local_1a8.m_data[0]._0_8_ != &local_1a8.m_data[0].m_hi) {
      operator_delete((void *)local_1a8.m_data[0]._0_8_,(long)local_1a8.m_data[0].m_hi + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._0_8_ != paVar32) {
      operator_delete((void *)local_408._0_8_,CONCAT44(local_408._20_4_,local_408._16_4_) + 1);
    }
    uVar20 = local_520._M_allocated_capacity;
    paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_530._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_530._0_8_ == &local_520) goto LAB_009830c3;
  }
  operator_delete(paVar32,(ulong)((long)&((_Base_ptr)uVar20)->_M_color + 1));
LAB_009830c3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_message._M_dataplus._M_p != &local_1f8.m_message.field_2) {
    operator_delete(local_1f8.m_message._M_dataplus._M_p,
                    local_1f8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_prefix._M_dataplus._M_p != &local_1f8.m_prefix.field_2) {
    operator_delete(local_1f8.m_prefix._M_dataplus._M_p,
                    local_1f8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_498);
  if (local_468.out1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_468.out1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_468.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_468.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_468.out0.
      super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_468.out0.
                    super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_468.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_468.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in1.
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in1.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in1.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in1.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_4d8;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}